

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.hh
# Opt level: O0

void __thiscall
QPDFParser::StackFrame::StackFrame(StackFrame *this,InputSource *input,parser_state_e state)

{
  int iVar1;
  undefined4 extraout_var;
  parser_state_e state_local;
  InputSource *input_local;
  StackFrame *this_local;
  
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&this->olist);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::map(&this->dict);
  this->state = state;
  std::__cxx11::string::string((string *)&this->key);
  iVar1 = (*input->_vptr_InputSource[4])();
  this->offset = CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::string((string *)&this->contents_string);
  this->contents_offset = -1;
  this->null_count = 0;
  return;
}

Assistant:

StackFrame(InputSource& input, parser_state_e state) :
            state(state),
            offset(input.tell())
        {
        }